

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O0

HighsStatus __thiscall Highs::getColIntegrality(Highs *this,HighsInt col,HighsVarType *integrality)

{
  size_type sVar1;
  const_reference pvVar2;
  value_type *in_RDX;
  uint in_ESI;
  long in_RDI;
  HighsInt num_col;
  HighsStatus local_4;
  
  if (((int)in_ESI < 0) || ((int)*(uint *)(in_RDI + 0x138) <= (int)in_ESI)) {
    highsLogUser((HighsLogOptions *)(in_RDI + 0xe28),kError,
                 "Index %d for column integrality is outside the range [0, num_col = %d)\n",
                 (ulong)in_ESI,(ulong)*(uint *)(in_RDI + 0x138));
    local_4 = kError;
  }
  else {
    sVar1 = std::vector<HighsVarType,_std::allocator<HighsVarType>_>::size
                      ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)(in_RDI + 0x2b0));
    if ((ulong)(long)(int)in_ESI < sVar1) {
      pvVar2 = std::vector<HighsVarType,_std::allocator<HighsVarType>_>::operator[]
                         ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)(in_RDI + 0x2b0),
                          (long)(int)in_ESI);
      *in_RDX = *pvVar2;
      local_4 = kOk;
    }
    else {
      highsLogUser((HighsLogOptions *)(in_RDI + 0xe28),kError,
                   "Model integrality does not exist for index %d\n",(ulong)in_ESI);
      local_4 = kError;
    }
  }
  return local_4;
}

Assistant:

HighsStatus Highs::getColIntegrality(const HighsInt col,
                                     HighsVarType& integrality) const {
  const HighsInt num_col = this->model_.lp_.num_col_;
  if (col < 0 || col >= num_col) {
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "Index %d for column integrality is outside the range [0, "
                 "num_col = %d)\n",
                 int(col), int(num_col));
    return HighsStatus::kError;
  }
  if (static_cast<size_t>(col) < this->model_.lp_.integrality_.size()) {
    integrality = this->model_.lp_.integrality_[col];
    return HighsStatus::kOk;
  } else {
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "Model integrality does not exist for index %d\n", int(col));
    return HighsStatus::kError;
  }
}